

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_error.c
# Opt level: O2

void l2_parsing_error(l2_parsing_error_type error_type,int lines,int cols,...)

{
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  va_list va;
  undefined8 local_b0;
  
  va[0].gp_offset = 0x18;
  va[0].fp_offset = 0x30;
  switch(error_type) {
  case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
    fprintf(_stderr,anon_var_dwarf_28f3,lines,(ulong)(uint)cols,(ulong)(uint)(int)(char)local_b0,
            (ulong)(uint)(int)(char)local_b0,0x3000000020,&stack0x00000008);
    goto LAB_00103915;
  case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
    fprintf(_stderr,anon_var_dwarf_2913,lines,(ulong)(uint)cols,(ulong)(uint)(int)(char)local_b0,
            in_R9,0x3000000020,&stack0x00000008);
    goto LAB_00103915;
  case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
    pcVar1 = anon_var_dwarf_2929;
    break;
  case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
    pcVar1 = anon_var_dwarf_2955;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
    pcVar1 = anon_var_dwarf_295f;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
    pcVar1 = anon_var_dwarf_293f;
    break;
  case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
    pcVar1 = anon_var_dwarf_2975;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
    pcVar1 = anon_var_dwarf_298b;
    break;
  case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
    va[0].gp_offset = 0x20;
    va[0].fp_offset = 0x30;
    pcVar1 = anon_var_dwarf_28fd;
    break;
  case L2_PARSING_ERROR_MISSING_COLON:
    pcVar1 = anon_var_dwarf_29a1;
    break;
  case L2_PARSING_ERROR_MISSING_SEMICOLON:
    pcVar1 = anon_var_dwarf_29b7;
    break;
  case L2_PARSING_ERROR_MISSING_RBRACE:
    pcVar1 = anon_var_dwarf_29cd;
    break;
  case L2_PARSING_ERROR_MISSING_RP:
    pcVar1 = anon_var_dwarf_29e3;
    break;
  case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
    pcVar1 = anon_var_dwarf_29f9;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
    pcVar1 = anon_var_dwarf_2a0f;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
    pcVar1 = anon_var_dwarf_2a19;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
    fprintf(_stderr,anon_var_dwarf_2a2f,lines,(ulong)(uint)cols,local_b0);
    pcVar1 = anon_var_dwarf_2a39;
    goto LAB_001038e0;
  case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
    pcVar1 = anon_var_dwarf_2a4f;
    break;
  case L2_PARSING_ERROR_EXPR_NOT_BOOL:
    pcVar1 = anon_var_dwarf_2a65;
    break;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    pcVar1 = anon_var_dwarf_2a85;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    pcVar1 = anon_var_dwarf_2a6f;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    pcVar1 = anon_var_dwarf_2a8f;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    pcVar1 = anon_var_dwarf_2a99;
    goto LAB_0010390b;
  case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    fprintf(_stderr,anon_var_dwarf_2aa3,lines,(ulong)(uint)cols,local_b0);
    fprintf(_stderr,"<%s> \'%s\' ",in_R8,local_b0);
    pcVar1 = "<%s>\n";
    in_R8 = in_R9;
LAB_001038e0:
    fprintf(_stderr,pcVar1,in_R8);
    goto LAB_00103915;
  case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    fprintf(_stderr,anon_var_dwarf_2ad9,lines,(ulong)(uint)cols,local_b0);
    fprintf(_stderr,"\'%s\' <%s>\n",local_b0,in_R8);
    goto LAB_00103915;
  case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
    pcVar1 = anon_var_dwarf_2aed;
    break;
  case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
    pcVar1 = anon_var_dwarf_2af7;
    break;
  case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
    pcVar1 = anon_var_dwarf_2b0d;
    break;
  case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
    pcVar1 = anon_var_dwarf_2b23;
LAB_0010390b:
    fprintf(_stderr,pcVar1,lines,(ulong)(uint)cols,local_b0,in_R9,0x3000000020,&stack0x00000008);
    goto LAB_00103915;
  case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
    pcVar1 = anon_var_dwarf_2b39;
    break;
  case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
    pcVar1 = anon_var_dwarf_2b43;
    break;
  case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
    pcVar1 = anon_var_dwarf_2b4d;
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
    pcVar1 = anon_var_dwarf_2b63;
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
    pcVar1 = anon_var_dwarf_2b6d;
    break;
  default:
    fwrite(anon_var_dwarf_2b77,0x30,1,_stderr);
    goto LAB_00103915;
  }
  fprintf(_stderr,pcVar1,lines,(ulong)(uint)cols,in_R8,in_R9,va[0]._0_8_,&stack0x00000008);
LAB_00103915:
  fwrite(anon_var_dwarf_28dd,0x1c,1,_stderr);
  l2_clean_before_abort();
  exit(error_type);
}

Assistant:

void _Noreturn l2_parsing_error(const l2_parsing_error_type error_type, int lines, int cols, ...) {

    va_list va;
    va_start(va, cols);

    char illegal_char;
    char *token_str, *token_str2;
    l2_token *token_p;

    switch (error_type) {
        case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法字符 \'%c\'(0x%X)\n", lines, cols, illegal_char, illegal_char);
            break;

        case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
            token_p = va_arg(va, l2_token *);
            /*
            switch (token_p->type) {

            }*/
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法词法元素\n", lines, cols);
            break;

        case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在八进制字面量中包含了非法数字 \'%c\'\n", lines, cols, illegal_char);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的十六进制字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的实数 (real) 字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t字符字面量不能为空\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符字面量, 字符字面量应该以单引号 ' 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在单个字符字面量中出现多个字符\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符串字面量, 字符串字面量应该以双引号 \" 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_COLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的条件表达式, 可能缺少冒号 \':\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_SEMICOLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在语句末尾可能缺少了分号\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RBRACE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少块结束符, 右花括号 }\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RP:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少右圆括号 \')\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 未定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 重定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 在初始化之前被引用了\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的操作 \'%s\' 在 ", lines, cols, token_str);
            token_str = va_arg(va, char *);
            fprintf(stderr, "%s 之上\n", token_str);
            break;

        case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t试图除以整数 0\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_NOT_BOOL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式不是布尔类型 (bool)\n", lines, cols);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 作用于不兼容的类型之上, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s> \'%s\' ", token_str2, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s>\n", token_str2);
            break;

        case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧具有不兼容的类型, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "\'%s\' <%s>\n", token_str, token_str2);
            break;

        case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'continue\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'break\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'return\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 并非过程, 无法进行调用\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太多\n", lines, cols);
            break;

        case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太少\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式并不具有任何值\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的表达式值类型\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的符号类型\n", lines, cols);
            break;

        default:
            fprintf(stderr, "L2 脚本解释错误, 出现一个未知错误\n");
    }

    fprintf(stderr, "L2 解释器已异常终止\n");

    va_end(va);
    l2_clean_before_abort();
    exit(error_type);
}